

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveconfig.cpp
# Opt level: O0

void __thiscall naiveconfig::print(naiveconfig *this)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  char local_98 [8];
  char dest_ip [128];
  in_addr dest_server;
  in_addr nproxy_server;
  naiveconfig *this_local;
  
  dest_ip._124_4_ = this->proxy_ipaddr;
  dest_ip._120_4_ = this->dest_ipaddr;
  pcVar3 = inet_ntoa((in_addr)dest_ip._120_4_);
  strcpy(local_98,pcVar3);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    bVar1 = this->protocol;
    pcVar3 = inet_ntoa((in_addr)dest_ip._124_4_);
    printf("PROTOCOL:          %s\nnproxy_server_ip:  %s\nnproxy_port:       %d\ndest_ipaddr:       %s\ndest_port:         %d\n"
           ,protocol_name + bVar1,pcVar3,(ulong)this->proxy_port,local_98,(ulong)this->dest_port);
  }
  else {
    bVar1 = this->protocol;
    pcVar3 = inet_ntoa((in_addr)dest_ip._124_4_);
    uVar2 = this->proxy_port;
    uVar5 = std::__cxx11::string::c_str();
    printf("PROTOCOL:          %s\nnproxy_server_ip:  %s\nnproxy_port:       %d\nhostname:          %s\ndest_ipaddr:       %s\ndest_port:         %d\n"
           ,protocol_name + bVar1,pcVar3,(ulong)uVar2,uVar5,local_98,(uint)this->dest_port);
  }
  return;
}

Assistant:

void naiveconfig::print()
{
    struct in_addr nproxy_server;
    nproxy_server.s_addr = proxy_ipaddr;

    struct in_addr dest_server;
    dest_server.s_addr = dest_ipaddr;
    char dest_ip[128];
    strcpy(dest_ip, inet_ntoa(dest_server));

    if (hostname.length() == 0)
    {
        //注意，inet_ntoa是不可重入的。
        printf("PROTOCOL:          %s\n"
               "nproxy_server_ip:  %s\n"
               "nproxy_port:       %d\n"
               "dest_ipaddr:       %s\n"
               "dest_port:         %d\n",
               protocol_name[protocol],
               inet_ntoa(nproxy_server),
               proxy_port,
               dest_ip,
               dest_port);
    }
    else
    {
        //注意，inet_ntoa是不可重入的。
        printf("PROTOCOL:          %s\n"
               "nproxy_server_ip:  %s\n"
               "nproxy_port:       %d\n"
               "hostname:          %s\n"
               "dest_ipaddr:       %s\n"
               "dest_port:         %d\n",
               protocol_name[protocol],
               inet_ntoa(nproxy_server),
               proxy_port,
               hostname.c_str(),
               dest_ip,
               dest_port);
    }
}